

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

TypeMetaFunction * __thiscall
soul::PoolAllocator::
allocate<soul::AST::TypeMetaFunction,soul::AST::Context_const&,soul::AST::Expression&,soul::AST::TypeMetaFunction::Op&>
          (PoolAllocator *this,Context *args,Expression *args_1,Op *args_2)

{
  DestructorFn *pDVar1;
  Context *this_00;
  _lambda_void___1_ local_39;
  TypeMetaFunction *local_38;
  TypeMetaFunction *newObject;
  PoolItem *newItem;
  Op *args_local_2;
  Expression *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_2;
  args_local_2 = (Op *)args_1;
  args_local_1 = (Expression *)args;
  args_local = (Context *)this;
  newObject = (TypeMetaFunction *)allocateSpaceForObject(this,0x40);
  this_00 = &(newObject->super_Expression).super_Statement.super_ASTObject.context;
  AST::TypeMetaFunction::TypeMetaFunction
            ((TypeMetaFunction *)this_00,(Context *)args_local_1,(Expression *)args_local_2,
             (Op)newItem->size);
  local_38 = (TypeMetaFunction *)this_00;
  pDVar1 = allocate(soul::AST::Context_const&,soul::AST::Expression&,soul::AST::TypeMetaFunction::Op&)
           ::{lambda(void*)#1}::operator_cast_to_function_pointer(&local_39);
  *(DestructorFn **)&(newObject->super_Expression).super_Statement.super_ASTObject.objectType =
       pDVar1;
  return local_38;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }